

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::UtcTimeOnlyConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeOnlyConvertor *this,UtcTimeOnly *value,
          int precision)

{
  int local_84;
  allocator local_51;
  int local_50 [2];
  signed_int local_48;
  signed_int local_44;
  int fraction;
  int second;
  int minute;
  int hour;
  char result [18];
  int local_1c;
  DateTime *pDStack_18;
  int precision_local;
  UtcTimeOnly *value_local;
  
  local_1c = (int)value;
  local_50[1] = 0;
  local_50[0] = 9;
  pDStack_18 = (DateTime *)this;
  value_local = (UtcTimeOnly *)__return_storage_ptr__;
  local_1c = clamp_of<int>(&local_1c,local_50 + 1,local_50);
  DateTime::getHMS(pDStack_18,&second,&fraction,&local_44,&local_48,local_1c);
  integer_to_string_padded((char *)&minute,2,second,'0');
  minute._2_1_ = 0x3a;
  integer_to_string_padded((char *)((long)&minute + 3),2,fraction,'0');
  hour._1_1_ = 0x3a;
  integer_to_string_padded((char *)((long)&hour + 2),2,local_44,'0');
  if (local_1c != 0) {
    result[0] = '.';
    integer_to_string_padded(result + 1,(long)local_1c,local_48,'0');
  }
  if (local_1c == 0) {
    local_84 = 8;
  }
  else {
    local_84 = local_1c + 9;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)&minute,(long)local_84,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( const UtcTimeOnly& value,
                              int precision = 0 )
  EXCEPT ( FieldConvertError )
  {
    char result[ 8+10 ]; // Maximum
    int hour, minute, second, fraction;

    precision = clamp_of( precision, 0, 9 );

    value.getHMS( hour, minute, second, fraction, precision );

    integer_to_string_padded ( result, 2, hour );
    result[2] = ':';
    integer_to_string_padded ( result + 3, 2, minute );
    result[5] = ':';
    integer_to_string_padded ( result + 6, 2, second );

    if( precision )
    {
      result[8] = '.';
      integer_to_string_padded ( result + 9, precision, fraction );
    }

    return std::string(result, precision ? (8 + 1 + precision) : 8);
  }